

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O0

RBTree * rbt_create(RBTree *tree,rbt_comparator comparator,void *comparator_arg)

{
  void *comparator_arg_local;
  rbt_comparator comparator_local;
  RBTree *tree_local;
  
  tree->root = &g_sentinel;
  tree->comparator = comparator;
  tree->comparator_arg = comparator_arg;
  return tree;
}

Assistant:

RBTree *
rbt_create(RBTree* tree,
           rbt_comparator comparator,
           void *comparator_arg)
{
    /* RBTree      *tree = (RBTree *) malloc(sizeof(RBTree)); */

    /* assert(node_size > sizeof(RBTNode)); */

    tree->root = RBTNIL;
    /* tree->node_size = node_size; */
    tree->comparator = comparator;
    /* tree->combiner = combiner; */
    /* tree->allocfunc = allocfunc; */
    /* tree->freefunc = freefunc; */

    tree->comparator_arg = comparator_arg;

    return tree;
}